

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Module.cpp
# Opt level: O2

Structure * __thiscall soul::Module::Structs::add(Structs *this,Structure *s)

{
  string_view name;
  RefCountedPtr<soul::Structure> local_20;
  
  name._M_str = (char *)(s->name)._M_string_length;
  name._M_len = (size_t)this;
  find((Structs *)&stack0xffffffffffffffe0,name);
  if (local_20.object == (Structure *)0x0) {
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&stack0xffffffffffffffe0);
    (s->super_RefCountedObject).refCount = (s->super_RefCountedObject).refCount + 1;
    local_20.object = s;
    ArrayWithPreallocation<soul::RefCountedPtr<soul::Structure>,_32UL>::push_back
              (&this->structs,&stack0xffffffffffffffe0);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&stack0xffffffffffffffe0);
    return s;
  }
  throwInternalCompilerError("find (s.getName()) == nullptr","add",0x74);
}

Assistant:

Structure& Module::Structs::add (Structure& s)
{
    SOUL_ASSERT (find (s.getName()) == nullptr);
    structs.push_back (s);
    return s;
}